

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.hpp
# Opt level: O0

deUint8 tcu::floatToU8(float fv)

{
  uint uVar1;
  undefined4 local_18;
  deUint32 m;
  deUint32 e;
  anon_union_4_3_8378f502 v;
  float fv_local;
  
  uVar1 = 0x7e - ((int)fv >> 0x17);
  local_18 = (((uint)fv & 0xffffff | 0x800000) * 0xff >> ((byte)uVar1 & 0x1f)) + 0x800000;
  if (8 < uVar1) {
    local_18 = uVar1;
  }
  return (deUint8)(local_18 >> 0x18);
}

Assistant:

inline deUint8 floatToU8 (float fv)
{
	union { float fv; deUint32 uv; deInt32 iv; } v;
	v.fv = fv;

	const deUint32	e	= (deUint32)(126-(v.iv>>23));
	deUint32		m	= v.uv;

	m &= 0x00ffffffu;
	m |= 0x00800000u;
	m  = (m << 8) - m;
	m  = 0x00800000u + (m >> e);

	if (e > 8)
		m = e;

	return (deUint8)(m>>24);
}